

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Maj3_ManVarMapPrint(Maj3_Man_t *p)

{
  Vec_Int_t *p_00;
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *__format;
  ulong uVar5;
  int (*paiVar6) [32];
  int Levels [32];
  int Firsts [32];
  
  Maj3_ManFirstAndLevel(p->vLevels,Firsts,Levels,p->nVars,p->nObjs);
  printf("Variable map for problem with %d inputs, %d nodes and %d levels: ",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes,(ulong)(uint)p->vLevels->nSize);
  p_00 = p->vLevels;
  printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
  for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
    uVar2 = Vec_IntEntry(p_00,iVar3);
    printf(" %d",(ulong)uVar2);
  }
  puts(" }");
  printf("    ");
  printf("      ");
  for (uVar5 = 0; (int)uVar5 < p->nObjs; uVar5 = (ulong)((int)uVar5 + 1)) {
    printf("%3d  ",uVar5);
  }
  putchar(10);
  uVar5 = (ulong)p->nObjs;
  paiVar6 = p->VarMarks + (uVar5 - 1);
  do {
    if ((long)uVar5 <= (long)p->nVars) {
      return;
    }
    uVar5 = uVar5 - 1;
    printf(" %2d ",uVar5 & 0xffffffff);
    printf(" %2d   ",(ulong)(uint)Levels[uVar5]);
    for (lVar4 = 0; lVar4 < p->nObjs; lVar4 = lVar4 + 1) {
      uVar2 = (*paiVar6)[lVar4];
      if (uVar2 == 1) {
        __format = "  +  ";
LAB_004aa059:
        printf(__format);
      }
      else {
        if (uVar2 == 0xffffffff) {
          __format = "  .  ";
          goto LAB_004aa059;
        }
        iVar3 = bmcg_sat_solver_read_cex_varvalue(p->pSat,uVar2);
        uVar1 = 0x2b;
        if (iVar3 == 0) {
          uVar1 = 0x20;
        }
        printf("%3d%c ",(ulong)uVar2,uVar1);
      }
    }
    putchar(10);
    paiVar6 = paiVar6 + -1;
  } while( true );
}

Assistant:

void Maj3_ManVarMapPrint( Maj3_Man_t * p )
{
    int i, k, Firsts[MAJ3_OBJS], Levels[MAJ3_OBJS];
    Maj3_ManFirstAndLevel( p->vLevels, Firsts, Levels, p->nVars, p->nObjs );
    // print
    printf( "Variable map for problem with %d inputs, %d nodes and %d levels: ", p->nVars, p->nNodes, Vec_IntSize(p->vLevels) );
    Vec_IntPrint( p->vLevels );
    printf( "    " );
    printf( "      " );
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d  ", i );
    printf( "\n" );
    for ( i = p->nObjs-1; i >= p->nVars; i-- )
    {
        printf( " %2d ", i );
        printf( " %2d   ", Levels[i] );
        for ( k = 0; k < p->nObjs; k++ )
            if ( p->VarMarks[i][k] == -1 )
                printf( "  .  " );
            else if ( p->VarMarks[i][k] == 1 )
                printf( "  +  " );
            else 
                printf( "%3d%c ", p->VarMarks[i][k], bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][k]) ? '+' : ' ' );
        printf( "\n" );
    }
}